

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall sensors_analytics::Sdk::~Sdk(Sdk *this)

{
  DefaultConsumer *this_00;
  PropertiesNode *this_01;
  Sdk *this_local;
  
  if (this->consumer_ != (DefaultConsumer *)0x0) {
    this_00 = this->consumer_;
    if (this_00 != (DefaultConsumer *)0x0) {
      DefaultConsumer::~DefaultConsumer(this_00);
      operator_delete(this_00);
    }
    this->consumer_ = (DefaultConsumer *)0x0;
  }
  if (this->super_properties_ != (PropertiesNode *)0x0) {
    this_01 = this->super_properties_;
    if (this_01 != (PropertiesNode *)0x0) {
      PropertiesNode::~PropertiesNode(this_01);
      operator_delete(this_01);
    }
    this->super_properties_ = (PropertiesNode *)0x0;
  }
  std::
  vector<sensors_analytics::UserAlterationObserver_*,_std::allocator<sensors_analytics::UserAlterationObserver_*>_>
  ::~vector(&this->observers);
  std::__cxx11::string::~string((string *)&this->staging_file_path_);
  std::__cxx11::string::~string((string *)&this->distinct_id_);
  return;
}

Assistant:

Sdk::~Sdk() {
  if (consumer_ != NULL) {
    delete consumer_;
    consumer_ = NULL;
  }
  if (super_properties_ != NULL) {
    delete super_properties_;
    super_properties_ = NULL;
  }
}